

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disas.h
# Opt level: O0

void sh4asm_disas_4xx3_(uint *quads,sh4asm_disas_emit_func em,uint32_t pc)

{
  uint32_t pc_local;
  sh4asm_disas_emit_func em_local;
  uint *quads_local;
  
  switch(quads[1]) {
  case 0:
    sh4asm_txt_stcl_sr_amrn(em,quads[2]);
    break;
  case 1:
    sh4asm_txt_stcl_gbr_amrn(em,quads[2]);
    break;
  case 2:
    sh4asm_txt_stcl_vbr_amrn(em,quads[2]);
    break;
  case 3:
    sh4asm_txt_stcl_ssr_amrn(em,quads[2]);
    break;
  case 4:
    sh4asm_txt_stcl_spc_amrn(em,quads[2]);
    break;
  default:
    sh4asm_opcode_non_inst_(quads,em);
    break;
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
    sh4asm_txt_stcl_rm_bank_amrn(em,quads[1] & 7,quads[2]);
  }
  return;
}

Assistant:

SH4ASM_STATIC void
sh4asm_disas_4xx3_(unsigned const *quads,
                   sh4asm_disas_emit_func em, uint32_t pc) {
    switch (quads[1]) {
    case 0:
        sh4asm_txt_stcl_sr_amrn(em, quads[2]);
        break;
    case 1:
        sh4asm_txt_stcl_gbr_amrn(em, quads[2]);
        break;
    case 2:
        sh4asm_txt_stcl_vbr_amrn(em, quads[2]);
        break;
    case 3:
        sh4asm_txt_stcl_ssr_amrn(em, quads[2]);
        break;
    case 4:
        sh4asm_txt_stcl_spc_amrn(em, quads[2]);
        break;
    case 8:
    case 9:
    case 10:
    case 11:
    case 12:
    case 13:
    case 14:
    case 15:
        sh4asm_txt_stcl_rm_bank_amrn(em, quads[1] & 7, quads[2]);
        break;
    default:
        sh4asm_opcode_non_inst_(quads, em);
    }
}